

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

Status * google::protobuf::util::converter::anon_unknown_8::WriteSFixed64
                   (Status *__return_storage_ptr__,int field_number,DataPiece *data,
                   CodedOutputStream *stream)

{
  Status *extraout_RAX;
  Status *pSVar1;
  undefined1 local_58 [8];
  StatusOr<long> i64;
  
  DataPiece::ToInt64((StatusOr<long> *)local_58,data);
  if (local_58._0_4_ == OK) {
    protobuf::internal::WireFormatLite::WriteSFixed64
              (field_number,i64.status_.error_message_.field_2._8_8_,stream);
  }
  Status::Status(__return_storage_ptr__,(Status *)local_58);
  pSVar1 = (Status *)&i64.status_.error_message_._M_string_length;
  if ((Status *)i64.status_._0_8_ != pSVar1) {
    operator_delete((void *)i64.status_._0_8_);
    pSVar1 = extraout_RAX;
  }
  return pSVar1;
}

Assistant:

inline Status WriteSFixed64(int field_number, const DataPiece& data,
                            CodedOutputStream* stream) {
  StatusOr<int64> i64 = data.ToInt64();
  if (i64.ok()) {
    WireFormatLite::WriteSFixed64(field_number, i64.value(), stream);
  }
  return i64.status();
}